

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall
RPCHelpMan::RPCHelpMan
          (RPCHelpMan *this,string name,string description,
          vector<RPCArg,_std::allocator<RPCArg>_> args,RPCResults results,RPCExamples examples)

{
  long *plVar1;
  string description_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args_00;
  RPCResults results_00;
  RPCExamples examples_00;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_R8;
  long *in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff10;
  code *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff48 [16];
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined8 in_stack_ffffffffffffff78;
  long in_stack_ffffffffffffff80;
  _Alloc_hider in_stack_ffffffffffffff88;
  undefined1 *puVar7;
  undefined8 local_60;
  pointer pRStack_58;
  undefined1 local_50 [24];
  _Alloc_hider _Stack_38;
  size_type local_30;
  
  local_30 = *(size_type *)(in_FS_OFFSET + 0x28);
  pRVar6 = (pointer)(in_RSI + 2);
  if ((pointer)*in_RSI == pRVar6) {
    local_50._16_8_ = *(undefined8 *)pRVar6;
    _Stack_38._M_p = (pointer)in_RSI[3];
    local_50._0_8_ = (pointer)(local_50 + 0x10);
  }
  else {
    local_50._16_8_ = *(undefined8 *)pRVar6;
    local_50._0_8_ = (pointer)*in_RSI;
  }
  local_50._8_8_ = in_RSI[1];
  *in_RSI = (long)pRVar6;
  in_RSI[1] = 0;
  *(undefined1 *)(in_RSI + 2) = 0;
  plVar1 = in_RDX + 2;
  if ((long *)*in_RDX == plVar1) {
    local_60 = *plVar1;
    pRStack_58 = (pointer)in_RDX[3];
    puVar7 = (undefined1 *)&stack0xffffffffffffffa0;
  }
  else {
    local_60 = *plVar1;
    puVar7 = (undefined1 *)*in_RDX;
  }
  *in_RDX = (long)plVar1;
  in_RDX[1] = 0;
  *(undefined1 *)(in_RDX + 2) = 0;
  pRVar3 = (pointer)*in_RCX;
  pRVar4 = (pointer)in_RCX[1];
  pRVar5 = (pointer)in_RCX[2];
  in_RCX[2] = 0;
  *in_RCX = 0;
  in_RCX[1] = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff40,in_R8);
  pRVar6 = (pointer)&stack0xffffffffffffff80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff70,*in_R9,in_R9[1] + *in_R9);
  pcVar2 = (code *)0x0;
  description_00.field_2 = in_stack_ffffffffffffff38;
  description_00._M_dataplus._M_p = (pointer)0x0;
  description_00._M_string_length = 0;
  args_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  args_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffff48._0_8_;
  args_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffff48._8_8_;
  results_00.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pRVar5;
  results_00.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pRVar4;
  results_00.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples_00.m_examples._M_string_length = in_stack_ffffffffffffff80;
  examples_00.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff78;
  examples_00.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffff88._M_p;
  examples_00.m_examples.field_2._8_8_ = puVar7;
  RPCHelpMan(this,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffff10,&stack0xffffffffffffff18)),
             description_00,args_00,results_00,examples_00,(RPCMethodImpl *)local_50);
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&stack0xffffffffffffff18,&stack0xffffffffffffff18,3);
  }
  if (pRVar6 != (pointer)&stack0xffffffffffffff80) {
    operator_delete(pRVar6,in_stack_ffffffffffffff80 + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff40);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffff58);
  if ((undefined8 *)puVar7 != &stack0xffffffffffffffa0) {
    operator_delete(puVar7,local_60 + 1);
  }
  if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan::RPCHelpMan(std::string name, std::string description, std::vector<RPCArg> args, RPCResults results, RPCExamples examples)
    : RPCHelpMan{std::move(name), std::move(description), std::move(args), std::move(results), std::move(examples), nullptr} {}